

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * testing::internal::OutputFlagAlsoCheckEnvVar_abi_cxx11_(void)

{
  string *in_RDI;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  char *local_20;
  char *xml_output_file_env;
  string *default_value_for_output_flag;
  
  xml_output_file_env._7_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",(allocator *)((long)&xml_output_file_env + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&xml_output_file_env + 6));
  local_20 = posix::GetEnv("XML_OUTPUT_FILE");
  if (local_20 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"xml:",&local_61);
    std::operator+(&local_40,&local_60,local_20);
    std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  return in_RDI;
}

Assistant:

std::string OutputFlagAlsoCheckEnvVar(){
  std::string default_value_for_output_flag = "";
  const char* xml_output_file_env = posix::GetEnv("XML_OUTPUT_FILE");
  if (NULL != xml_output_file_env) {
    default_value_for_output_flag = std::string("xml:") + xml_output_file_env;
  }
  return default_value_for_output_flag;
}